

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O3

void Map_MappingSetPiArrivalTimes(Map_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  Map_Node_t *pMVar6;
  Map_Time_t *pMVar7;
  float *pfVar8;
  Scl_Con_t *pSVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  float fVar15;
  
  if (0 < p->nInputs) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pMVar6 = p->pInputs[lVar11];
      pSVar9 = Scl_ConReadMan();
      if (pSVar9 == (Scl_Con_t *)0x0) {
        pMVar7 = p->pInputArrivals;
        pMVar6->tArrival[1].Worst = *(float *)((long)&pMVar7->Worst + lVar10);
        uVar14 = *(undefined8 *)((long)&pMVar7->Rise + lVar10);
        pMVar6->tArrival[1].Rise = (float)(int)uVar14;
        pMVar6->tArrival[1].Fall = (float)(int)((ulong)uVar14 >> 0x20);
      }
      else {
        pSVar9 = Scl_ConReadMan();
        if ((pSVar9->vInArrs).nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        fVar12 = (float)(pSVar9->vInArrs).pArray[lVar11] / 1000.0;
        pMVar6->tArrival[1].Fall = fVar12;
        pMVar6->tArrival[1].Rise = fVar12;
        pMVar6->tArrival[1].Worst = fVar12;
      }
      pfVar8 = p->pNodeDelays;
      if (pfVar8 == (float *)0x0) {
        uVar1 = pMVar6->tArrival[1].Rise;
        uVar3 = pMVar6->tArrival[1].Fall;
        uVar14 = CONCAT44((float)uVar3 + 0.0,(float)uVar1 + 0.0);
        pMVar6->tArrival[1].Rise = (float)uVar1 + 0.0;
        pMVar6->tArrival[1].Fall = (float)uVar3 + 0.0;
        fVar12 = 0.0;
      }
      else {
        iVar5 = pMVar6->Num;
        fVar13 = pfVar8[iVar5] + pMVar6->tArrival[1].Rise;
        pMVar6->tArrival[1].Rise = fVar13;
        fVar15 = pfVar8[iVar5] + pMVar6->tArrival[1].Fall;
        pMVar6->tArrival[1].Fall = fVar15;
        fVar12 = pfVar8[iVar5];
        uVar14 = CONCAT44(fVar15,fVar13);
      }
      pMVar6->tArrival[1].Worst = fVar12 + pMVar6->tArrival[1].Worst;
      uVar2 = (p->pSuperLib->tDelayInv).Rise;
      uVar4 = (p->pSuperLib->tDelayInv).Fall;
      fVar13 = (float)uVar4 + (float)uVar14;
      fVar15 = (float)uVar2 + (float)((ulong)uVar14 >> 0x20);
      fVar12 = fVar15;
      if (fVar15 <= fVar13) {
        fVar12 = fVar13;
      }
      pMVar6->tArrival[0].Rise = fVar15;
      pMVar6->tArrival[0].Fall = fVar13;
      pMVar6->tArrival[0].Worst = fVar12;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < p->nInputs);
  }
  return;
}

Assistant:

void Map_MappingSetPiArrivalTimes( Map_Man_t * p )
{
    Map_Node_t * pNode;
    int i;
    for ( i = 0; i < p->nInputs; i++ )
    {
        pNode = p->pInputs[i];
        // set the arrival time of the positive phase
        if ( Scl_ConIsRunning() )
        {
            float Time = Scl_ConGetInArrFloat( i );
            pNode->tArrival[1].Fall  = Time;
            pNode->tArrival[1].Rise  = Time;
            pNode->tArrival[1].Worst = Time;
        }
        else
            pNode->tArrival[1] = p->pInputArrivals[i];
        pNode->tArrival[1].Rise  += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        pNode->tArrival[1].Fall  += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        pNode->tArrival[1].Worst += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        // set the arrival time of the negative phase
        pNode->tArrival[0].Rise  = pNode->tArrival[1].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[0].Fall  = pNode->tArrival[1].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[0].Worst = MAP_MAX(pNode->tArrival[0].Rise, pNode->tArrival[0].Fall);
    }
}